

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityID.h
# Opt level: O2

void __thiscall DIS::WarfareFamilyPdu::setFiringEntityID(WarfareFamilyPdu *this,EntityID *pX)

{
  unsigned_short uVar1;
  
  (this->_firingEntityID)._entity = pX->_entity;
  uVar1 = pX->_application;
  (this->_firingEntityID)._site = pX->_site;
  (this->_firingEntityID)._application = uVar1;
  return;
}

Assistant:

class OPENDIS6_EXPORT EntityID
{
protected:
  /** The site ID */
  unsigned short _site; 

  /** The application ID */
  unsigned short _application; 

  /** the entity ID */
  unsigned short _entity; 


 public:
    EntityID();
    virtual ~EntityID();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getSite() const; 
    void setSite(unsigned short pX); 

    unsigned short getApplication() const; 
    void setApplication(unsigned short pX); 

    unsigned short getEntity() const; 
    void setEntity(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const EntityID& rhs) const;
}